

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  NodeRef nodeRef;
  long lVar12;
  size_t sVar13;
  NodeRef *pNVar14;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar15;
  ulong uVar16;
  size_t sVar17;
  Primitive *prim;
  bool bVar18;
  byte bVar19;
  ulong uVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [64];
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  vint4 ai_3;
  vint4 bi;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_3;
  undefined1 auVar37 [16];
  vint4 bi_2;
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  vbool<4>_conflict valid0;
  InstanceIntersectorK<4> local_357a;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar21 [16];
  
  sVar17 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar17 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar8 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    uVar20 = vpcmpeqd_avx512vl(auVar8,(undefined1  [16])valid_i->field_0);
    uVar20 = ((byte)uVar9 & 0xf) & uVar20;
    bVar19 = (byte)uVar20;
    if (bVar19 != 0) {
      auVar8 = *(undefined1 (*) [16])(ray + 0x40);
      auVar3 = *(undefined1 (*) [16])(ray + 0x50);
      auVar33 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar38 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar21 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      aVar22._0_4_ = (uint)(bVar19 & 1) * auVar21._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
      bVar18 = (bool)((byte)(uVar20 >> 1) & 1);
      aVar22._4_4_ = (uint)bVar18 * auVar21._4_4_ | (uint)!bVar18 * 0x7f800000;
      bVar18 = (bool)((byte)(uVar20 >> 2) & 1);
      aVar22._8_4_ = (uint)bVar18 * auVar21._8_4_ | (uint)!bVar18 * 0x7f800000;
      bVar18 = SUB81(uVar20 >> 3,0);
      aVar22._12_4_ = (uint)bVar18 * auVar21._12_4_ | (uint)!bVar18 * 0x7f800000;
      auVar21 = *(undefined1 (*) [16])(ray + 0x10);
      auVar25 = *(undefined1 (*) [16])(ray + 0x20);
      auVar27._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar27._8_4_ = auVar25._8_4_ ^ 0x80000000;
      auVar27._12_4_ = auVar25._12_4_ ^ 0x80000000;
      bVar11 = (byte)((ushort)((short)uVar20 << 0xc) >> 0xc) ^ 0xf;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar17;
      stack_near[1].field_0 = aVar22;
      if (sVar17 != 0xfffffffffffffff8) {
        auVar24._8_4_ = 0x7fffffff;
        auVar24._0_8_ = 0x7fffffff7fffffff;
        auVar24._12_4_ = 0x7fffffff;
        auVar25 = vandps_avx(auVar8,auVar24);
        auVar35._8_4_ = 0x219392ef;
        auVar35._0_8_ = 0x219392ef219392ef;
        auVar35._12_4_ = 0x219392ef;
        uVar16 = vcmpps_avx512vl(auVar25,auVar35,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        auVar25._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._0_4_;
        bVar18 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._4_4_;
        bVar18 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._8_4_;
        bVar18 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._12_4_;
        auVar8 = vandps_avx(auVar3,auVar24);
        uVar16 = vcmpps_avx512vl(auVar8,auVar35,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        auVar26._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar3._0_4_;
        bVar18 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar3._4_4_;
        bVar18 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar3._8_4_;
        bVar18 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar3._12_4_;
        auVar8 = vandps_avx(auVar33,auVar24);
        uVar16 = vcmpps_avx512vl(auVar8,auVar35,1);
        bVar18 = (bool)((byte)uVar16 & 1);
        auVar23._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar33._0_4_;
        bVar18 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar23._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar33._4_4_;
        bVar18 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar23._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar33._8_4_;
        bVar18 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar23._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar33._12_4_;
        auVar24 = vrcp14ps_avx512vl(auVar25);
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar3 = vfnmadd213ps_fma(auVar25,auVar24,auVar33);
        auVar25 = vrcp14ps_avx512vl(auVar26);
        auVar8 = vfnmadd213ps_fma(auVar26,auVar25,auVar33);
        auVar26 = vrcp14ps_avx512vl(auVar23);
        auVar33 = vfnmadd213ps_fma(auVar23,auVar26,auVar33);
        auVar8 = vfmadd132ps_fma(auVar8,auVar25,auVar25);
        auVar3 = vfmadd132ps_fma(auVar3,auVar24,auVar24);
        auVar33 = vfmadd132ps_fma(auVar33,auVar26,auVar26);
        pNVar14 = stack_node + 1;
        auVar39._0_4_ = auVar3._0_4_ * -*(float *)ray;
        auVar39._4_4_ = auVar3._4_4_ * -*(float *)(ray + 4);
        auVar39._8_4_ = auVar3._8_4_ * -*(float *)(ray + 8);
        auVar39._12_4_ = auVar3._12_4_ * -*(float *)(ray + 0xc);
        auVar40._0_4_ = auVar8._0_4_ * -auVar21._0_4_;
        auVar40._4_4_ = auVar8._4_4_ * -auVar21._4_4_;
        auVar40._8_4_ = auVar8._8_4_ * -auVar21._8_4_;
        auVar40._12_4_ = auVar8._12_4_ * -auVar21._12_4_;
        auVar21 = vmulps_avx512vl(auVar33,auVar27);
        auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
        bVar18 = (bool)((byte)(uVar20 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
        bVar6 = SUB81(uVar20 >> 3,0);
        auVar41 = ZEXT1664(CONCAT412((uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar25._12_4_,
                                     CONCAT48((uint)bVar5 * auVar27._8_4_ |
                                              (uint)!bVar5 * auVar25._8_4_,
                                              CONCAT44((uint)bVar18 * auVar27._4_4_ |
                                                       (uint)!bVar18 * auVar25._4_4_,
                                                       (uint)(bVar19 & 1) * auVar27._0_4_ |
                                                       (uint)!(bool)(bVar19 & 1) * auVar25._0_4_))))
        ;
        paVar15 = &stack_near[2].field_0;
LAB_00775a19:
        do {
          paVar1 = paVar15 + -1;
          auVar31 = ZEXT1664((undefined1  [16])*paVar1);
          paVar15 = paVar15 + -1;
          auVar25 = auVar41._0_16_;
          uVar9 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar25,1);
          if ((char)uVar9 == '\0') goto LAB_00775c5a;
          do {
            if ((sVar17 & 8) != 0) {
              if (sVar17 == 0xfffffffffffffff8) goto LAB_00775c7e;
              uVar9 = vcmpps_avx512vl(auVar25,auVar31._0_16_,6);
              if ((char)uVar9 == '\0') goto LAB_00775c5a;
              uVar20 = (ulong)((uint)sVar17 & 0xf);
              valid0.v = bVar11 ^ 0xf;
              bVar10 = bVar11;
              if (uVar20 == 8) goto LAB_00775c45;
              prim = (Primitive *)(sVar17 & 0xfffffffffffffff0);
              uVar16 = 1;
              goto LAB_00775bb8;
            }
            lVar12 = 0;
            sVar13 = 8;
            aVar30 = auVar38._0_16_;
            do {
              sVar4 = *(size_t *)((sVar17 & 0xfffffffffffffff0) + lVar12 * 8);
              if (sVar4 == 8) {
                auVar31 = ZEXT1664((undefined1  [16])aVar30);
                break;
              }
              uVar2 = *(undefined4 *)(sVar17 + 0x40 + lVar12 * 4);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar23 = vfmadd132ps_fma(auVar32,auVar39,auVar3);
              uVar2 = *(undefined4 *)(sVar17 + 0x80 + lVar12 * 4);
              auVar28._4_4_ = uVar2;
              auVar28._0_4_ = uVar2;
              auVar28._8_4_ = uVar2;
              auVar28._12_4_ = uVar2;
              auVar24 = vfmadd132ps_fma(auVar28,auVar40,auVar8);
              uVar2 = *(undefined4 *)(sVar17 + 0xc0 + lVar12 * 4);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              auVar28 = vfmadd132ps_avx512vl(auVar29,auVar21,auVar33);
              uVar2 = *(undefined4 *)(sVar17 + 0x60 + lVar12 * 4);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar35 = vfmadd132ps_fma(auVar34,auVar39,auVar3);
              uVar2 = *(undefined4 *)(sVar17 + 0xa0 + lVar12 * 4);
              auVar36._4_4_ = uVar2;
              auVar36._0_4_ = uVar2;
              auVar36._8_4_ = uVar2;
              auVar36._12_4_ = uVar2;
              auVar32 = vfmadd132ps_fma(auVar36,auVar40,auVar8);
              uVar2 = *(undefined4 *)(sVar17 + 0xe0 + lVar12 * 4);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              auVar29 = vfmadd132ps_avx512vl(auVar37,auVar21,auVar33);
              auVar27 = vpminsd_avx(auVar23,auVar35);
              auVar26 = vpminsd_avx(auVar24,auVar32);
              auVar27 = vpmaxsd_avx(auVar27,auVar26);
              auVar26 = vpminsd_avx(auVar28,auVar29);
              auVar27 = vpmaxsd_avx(auVar27,auVar26);
              auVar26 = vpmaxsd_avx(auVar23,auVar35);
              auVar23 = vpmaxsd_avx(auVar24,auVar32);
              auVar24 = vpminsd_avx(auVar26,auVar23);
              auVar26 = vpmaxsd_avx(auVar28,auVar29);
              auVar23 = vpmaxsd_avx(auVar27,(undefined1  [16])aVar22);
              auVar26 = vpminsd_avx512vl(auVar26,auVar25);
              auVar26 = vpminsd_avx(auVar24,auVar26);
              uVar20 = vpcmpd_avx512vl(auVar23,auVar26,2);
              uVar20 = uVar20 & 0xf;
              if ((byte)uVar20 == 0) {
                auVar31 = ZEXT1664((undefined1  [16])aVar30);
                sVar4 = sVar13;
              }
              else {
                auVar26 = vblendmps_avx512vl((undefined1  [16])auVar38._0_16_,auVar27);
                bVar18 = (bool)((byte)uVar20 & 1);
                bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
                bVar7 = SUB81(uVar20 >> 3,0);
                auVar31 = ZEXT1664(CONCAT412((uint)bVar7 * auVar26._12_4_ |
                                             (uint)!bVar7 * auVar27._12_4_,
                                             CONCAT48((uint)bVar6 * auVar26._8_4_ |
                                                      (uint)!bVar6 * auVar27._8_4_,
                                                      CONCAT44((uint)bVar5 * auVar26._4_4_ |
                                                               (uint)!bVar5 * auVar27._4_4_,
                                                               (uint)bVar18 * auVar26._0_4_ |
                                                               (uint)!bVar18 * auVar27._0_4_))));
                if (sVar13 != 8) {
                  pNVar14->ptr = sVar13;
                  pNVar14 = pNVar14 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar15->v = aVar30;
                  paVar15 = paVar15 + 1;
                }
              }
              sVar13 = sVar4;
              lVar12 = lVar12 + 1;
              aVar30 = auVar31._0_16_;
            } while (lVar12 != 8);
            sVar17 = sVar13;
          } while (sVar13 != 8);
          sVar17 = pNVar14[-1].ptr;
          pNVar14 = pNVar14 + -1;
        } while (sVar17 != 0xfffffffffffffff8);
      }
LAB_00775c7e:
      bVar11 = bVar11 & bVar19;
      bVar18 = (bool)(bVar11 >> 1 & 1);
      bVar5 = (bool)(bVar11 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar11 & 1) * -0x800000 | (uint)!(bool)(bVar11 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar11 >> 3) * -0x800000 | (uint)!(bool)(bVar11 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar18 = uVar20 - 8 <= uVar16;
    uVar16 = uVar16 + 1;
    if (bVar18) break;
LAB_00775bb8:
    InstanceIntersectorK<4>::occluded(&local_357a,&valid0,&pre,ray,context,prim);
    bVar10 = ~(byte)local_357a & valid0.v;
    valid0.v = bVar10 & 0xf;
    if (valid0.v == 0) break;
  }
  bVar10 = bVar10 & 0xf ^ 0xf;
  auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
LAB_00775c45:
  bVar11 = bVar10 | bVar11;
  if (bVar11 == 0xf) {
    bVar11 = 0xf;
    goto LAB_00775c7e;
  }
  auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar18 = (bool)(bVar11 >> 1 & 1);
  bVar5 = (bool)(bVar11 >> 2 & 1);
  auVar41 = ZEXT1664(CONCAT412((uint)(bVar11 >> 3) * auVar25._12_4_ |
                               (uint)!(bool)(bVar11 >> 3) * auVar41._12_4_,
                               CONCAT48((uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * auVar41._8_4_,
                                        CONCAT44((uint)bVar18 * auVar25._4_4_ |
                                                 (uint)!bVar18 * auVar41._4_4_,
                                                 (uint)(bVar11 & 1) * auVar25._0_4_ |
                                                 (uint)!(bool)(bVar11 & 1) * auVar41._0_4_))));
LAB_00775c5a:
  sVar17 = pNVar14[-1].ptr;
  pNVar14 = pNVar14 + -1;
  if (sVar17 == 0xfffffffffffffff8) goto LAB_00775c7e;
  goto LAB_00775a19;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }